

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall cppcms::http::context::on_request_ready(context *this,bool error)

{
  _data *p_Var1;
  unspecified_bool_type uVar2;
  application *this_00;
  byte in_SIL;
  long in_RDI;
  string *unaff_retaddr;
  shared_ptr<cppcms::application_specific_pool> *in_stack_00000008;
  context *in_stack_00000010;
  bool in_stack_00000037;
  string *in_stack_00000038;
  intrusive_ptr<cppcms::application> *in_stack_00000040;
  exception *e;
  context_guard g;
  intrusive_ptr<cppcms::application> app;
  shared_ptr<cppcms::application_specific_pool> pool;
  context *in_stack_fffffffffffffe68;
  _data *in_stack_fffffffffffffe70;
  application *in_stack_fffffffffffffe78;
  context_guard *in_stack_fffffffffffffe80;
  intrusive_ptr<cppcms::application> local_28 [3];
  byte local_9;
  long lVar3;
  undefined1 now;
  
  local_9 = in_SIL & 1;
  lVar3 = in_RDI;
  std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3a0a38);
  now = (undefined1)((ulong)lVar3 >> 0x38);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr(local_28);
  booster::hold_ptr<cppcms::http::context::_data>::operator->
            ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  std::__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>::swap
            ((__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_fffffffffffffe70,
             (__shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_fffffffffffffe68);
  p_Var1 = booster::hold_ptr<cppcms::http::context::_data>::operator->
                     ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
  booster::intrusive_ptr<cppcms::application>::swap(local_28,&p_Var1->app);
  if ((local_9 & 1) == 0) {
    uVar2 = booster::intrusive_ptr::operator_cast_to__((intrusive_ptr *)local_28);
    if (uVar2 == 0xffffffffffffffff) {
      std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffe70,
                 (shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe70 =
           booster::hold_ptr<cppcms::http::context::_data>::operator->
                     ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
      submit_to_pool_internal(in_stack_00000010,in_stack_00000008,unaff_retaddr,(bool)now);
      std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)0x3a0ff3);
    }
    else {
      this_00 = booster::intrusive_ptr<cppcms::application>::operator->(local_28);
      self(in_stack_fffffffffffffe68);
      application::assign_context
                (this_00,(shared_ptr<cppcms::http::context> *)in_stack_fffffffffffffe78);
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x3a0f26);
      booster::hold_ptr<cppcms::http::context::_data>::operator->
                ((hold_ptr<cppcms::http::context::_data> *)(in_RDI + 0x10));
      dispatch(in_stack_00000040,in_stack_00000038,in_stack_00000037);
    }
  }
  else {
    uVar2 = booster::intrusive_ptr::operator_cast_to__((intrusive_ptr *)local_28);
    if (uVar2 != 0xffffffffffffffff) {
      booster::intrusive_ptr<cppcms::application>::get(local_28);
      anon_unknown_3::context_guard::context_guard
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 (context *)in_stack_fffffffffffffe70);
      request((context *)0x3a0b31);
      http::request::on_error((request *)in_stack_fffffffffffffe70);
      anon_unknown_3::context_guard::~context_guard((context_guard *)in_stack_fffffffffffffe70);
    }
  }
  booster::intrusive_ptr<cppcms::application>::~intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_stack_fffffffffffffe70);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x3a1018);
  return;
}

Assistant:

void context::on_request_ready(bool error)
{
	booster::shared_ptr<application_specific_pool> pool;
	booster::intrusive_ptr<application> app;
	pool.swap(d->pool);
	app.swap(d->app);

	if(error) {
		if(app) {
			try {
				context_guard g(app.get(),*this);
				request().on_error();
			}
			catch(std::exception const &e) {
				BOOSTER_ERROR("cppcms") << "exception at request::on_error" << e.what() << booster::trace(e);
			}
			catch(...) {
				BOOSTER_ERROR("cppcms") << "Unknown exception at request::on_error";
			}
		}
		return;
	}

	if(app) {
		app->assign_context(self());
		dispatch(app,d->matched,false);
		return;
	}

	submit_to_pool_internal(pool,d->matched,true);
}